

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

void __thiscall soul::PoolAllocator::Pool::~Pool(Pool *this)

{
  char *pcVar1;
  code *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = this->nextSlot;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      pcVar1 = (this->space)._M_elems + uVar4;
      pcVar2 = *(code **)((this->space)._M_elems + uVar4 + 8);
      if (pcVar2 != (code *)0x0) {
        (*pcVar2)(pcVar1 + 0x10);
        uVar3 = this->nextSlot;
      }
      uVar4 = uVar4 + *(long *)pcVar1;
    } while (uVar4 < uVar3);
  }
  return;
}

Assistant:

~Pool()
        {
            for (size_t i = 0; i < nextSlot;)
            {
                auto item = getItem (i);

                if (item->destructor != nullptr)
                    item->destructor (&item->item);

                i += item->size;
            }
        }